

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::SetDistinct
          (DataTable *this,column_t column_id,
          unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
          *distinct_stats)

{
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> _Var1;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> _Var2;
  RowGroupCollection *this_00;
  pointer *__ptr_1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> local_18;
  
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  local_18._M_head_impl =
       (distinct_stats->
       super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
       .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl;
  (distinct_stats->
  super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (DistinctStatistics *)0x0;
  RowGroupCollection::SetDistinct
            (this_00,column_id,
             (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  if (local_18._M_head_impl != (DistinctStatistics *)0x0) {
    _Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
         ((local_18._M_head_impl)->log).
         super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
         super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
         super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>;
    if (_Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl != (HyperLogLog *)0x0
       ) {
      operator_delete((void *)_Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl
                     );
    }
    operator_delete(_Var2._M_head_impl);
  }
  return;
}

Assistant:

void DataTable::SetDistinct(column_t column_id, unique_ptr<DistinctStatistics> distinct_stats) {
	D_ASSERT(column_id != COLUMN_IDENTIFIER_ROW_ID);
	row_groups->SetDistinct(column_id, std::move(distinct_stats));
}